

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemView::inputMethodEvent(QAbstractItemView *this,QInputMethodEvent *event)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  FocusPolicy FVar5;
  QAbstractItemViewPrivate *pQVar6;
  QWidget *this_00;
  long *plVar7;
  QString *pQVar8;
  QInputMethodEvent *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *currentEditor_1;
  QAbstractItemDelegate *delegate;
  QWidget *currentEditor;
  bool preediting;
  bool commit;
  bool forwardEventToEditor;
  QAbstractItemViewPrivate *d;
  QModelIndex *in_stack_ffffffffffffff30;
  QWidget *pQVar9;
  QAbstractItemViewPrivate *this_01;
  QWidget *local_b8;
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QAbstractItemView *)0x809545);
  bVar1 = false;
  QInputMethodEvent::commitString(in_RSI);
  bVar2 = QString::isEmpty((QString *)0x809561);
  bVar3 = (bVar2 ^ 0xffU) & 1;
  QInputMethodEvent::preeditString(in_RSI);
  bVar2 = QString::isEmpty((QString *)0x80957b);
  bVar4 = (bVar2 ^ 0xffU) & 1;
  this_01 = pQVar6;
  currentIndex((QAbstractItemView *)in_stack_ffffffffffffff30);
  QAbstractItemViewPrivate::editorForIndex(in_RDI,in_stack_ffffffffffffff30);
  this_00 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x8095b9);
  if (this_00 == (QWidget *)0x0) {
    if (bVar4 == 0) {
      if (bVar3 == 0) {
        QEvent::ignore((QEvent *)in_RSI);
        goto LAB_008097e7;
      }
    }
    else {
      pQVar6->waitForIMCommit = true;
      bVar1 = true;
    }
  }
  else if ((pQVar6->waitForIMCommit & 1U) != 0) {
    if ((bVar3 == 0) && (bVar4 != 0)) {
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)in_RSI);
    }
    else {
      pQVar6->waitForIMCommit = false;
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)in_RSI);
      if (bVar3 == 0) {
        currentIndex((QAbstractItemView *)in_stack_ffffffffffffff30);
        plVar7 = (long *)(**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).
                                                super_QFramePrivate.super_QWidgetPrivate + 0x208))
                                   (in_RDI,local_38);
        if (plVar7 != (long *)0x0) {
          pQVar9 = this_00;
          currentIndex((QAbstractItemView *)this_00);
          (**(code **)(*plVar7 + 0x80))(plVar7,pQVar9,local_50);
        }
        QAbstractItemViewPrivate::selectAllInEditor(this_01,(QWidget *)in_RDI);
      }
      FVar5 = QWidget::focusPolicy(this_00);
      if (FVar5 != NoFocus) {
        QWidget::setFocus((QWidget *)0x8096b2);
      }
    }
    goto LAB_008097e7;
  }
  currentIndex((QAbstractItemView *)in_stack_ffffffffffffff30);
  bVar4 = (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate + 0x2e0))(in_RDI,local_68,0x10,in_RSI);
  if (((bVar4 ^ 0xff) & 1) == 0) {
    local_b8 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    bVar2 = false;
    if (bVar1) {
      currentIndex((QAbstractItemView *)in_stack_ffffffffffffff30);
      QAbstractItemViewPrivate::editorForIndex(in_RDI,in_stack_ffffffffffffff30);
      local_b8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x8097bc);
      bVar2 = local_b8 != (QWidget *)0x0;
    }
    if (bVar2) {
      QCoreApplication::sendEvent(&local_b8->super_QObject,(QEvent *)in_RSI);
    }
  }
  else {
    pQVar6->waitForIMCommit = false;
    if (bVar3 != 0) {
      pQVar8 = QInputMethodEvent::commitString(in_RSI);
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate + 0x1d8))(in_RDI,pQVar8);
    }
    QEvent::ignore((QEvent *)in_RSI);
  }
LAB_008097e7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::inputMethodEvent(QInputMethodEvent *event)
{
    Q_D(QAbstractItemView);
    // When QAbstractItemView::AnyKeyPressed is used, a new IM composition might
    // start before the editor widget acquires focus. Changing focus would interrupt
    // the composition, so we keep focus on the view until that first composition
    // is complete, and pass QInputMethoEvents on to the editor widget so that the
    // user gets the expected feedback. See also inputMethodQuery, which redirects
    // calls to the editor widget during that period.
    bool forwardEventToEditor = false;
    const bool commit = !event->commitString().isEmpty();
    const bool preediting = !event->preeditString().isEmpty();
    if (QWidget *currentEditor = d->editorForIndex(currentIndex()).widget) {
        if (d->waitForIMCommit) {
            if (commit || !preediting) {
                // commit or cancel
                d->waitForIMCommit = false;
                QApplication::sendEvent(currentEditor, event);
                if (!commit) {
                    QAbstractItemDelegate *delegate = itemDelegateForIndex(currentIndex());
                    if (delegate)
                        delegate->setEditorData(currentEditor, currentIndex());
                    d->selectAllInEditor(currentEditor);
                }
                if (currentEditor->focusPolicy() != Qt::NoFocus)
                    currentEditor->setFocus();
            } else {
                // more pre-editing
                QApplication::sendEvent(currentEditor, event);
            }
            return;
        }
    } else if (preediting) {
        // don't set focus when the editor opens
        d->waitForIMCommit = true;
        // but pass preedit on to editor
        forwardEventToEditor = true;
    } else if (!commit) {
        event->ignore();
        return;
    }
    if (!edit(currentIndex(), AnyKeyPressed, event)) {
        d->waitForIMCommit = false;
        if (commit)
            keyboardSearch(event->commitString());
        event->ignore();
    } else if (QWidget *currentEditor; forwardEventToEditor
               && (currentEditor = d->editorForIndex(currentIndex()).widget)) {
        QApplication::sendEvent(currentEditor, event);
    }
}